

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

_tExecReaction __thiscall yactfr::internal::Vm::_execReadFlUIntBeRev(Vm *this,Instr *instr)

{
  unsigned_long val;
  
  val = _readFlInt<unsigned_long,_yactfr::internal::(anonymous_namespace)::readFlUIntBeFuncs,_true>
                  (this,instr);
  _setFlIntElem(this,val,instr);
  _consumeExistingBits(this,(ulong)*(uint *)((long)&instr[2]._vptr_Instr + 4));
  return FetchNextInstrAndStop;
}

Assistant:

Vm::_tExecReaction Vm::_execReadFlUIntBeRev(const Instr& instr)
{
    this->_execReadFlInt<std::uint64_t, readFlUIntBeFuncs, true>(instr);
    return _tExecReaction::FetchNextInstrAndStop;
}